

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O0

void db_drop_test(void)

{
  fdb_status fVar1;
  size_t sVar2;
  void *pvVar3;
  fdb_kvs_handle *in_stack_fffffffffffffad8;
  fdb_file_handle *in_stack_fffffffffffffae0;
  fdb_doc **in_stack_fffffffffffffae8;
  size_t in_stack_fffffffffffffb00;
  char *bodylen;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_status status;
  fdb_doc *rdoc;
  fdb_doc **doc;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  int n;
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.chunksize = 0;
  fconfig._2_2_ = 0x100;
  fconfig.blocksize = 0;
  fconfig.buffercache_size = 0x400;
  fconfig.purging_interval = 1;
  fconfig.flags._3_1_ = 0;
  fdb_open((fdb_file_handle **)bodybuf._152_8_,(char *)bodybuf._144_8_,(fdb_config *)bodybuf._136_8_
          );
  fdb_kvs_open((fdb_file_handle *)bodybuf._40_8_,(fdb_kvs_handle **)bodybuf._32_8_,
               (char *)bodybuf._24_8_,(fdb_kvs_config *)bodybuf._16_8_);
  fVar1 = fdb_set_log_callback((fdb_kvs_handle *)doc,logCallbackFunc,"db_drop_test");
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x527);
    db_drop_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x527,"void db_drop_test()");
    }
  }
  for (n = 0; n < 2; n = n + 1) {
    sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)n);
    sprintf(bodybuf + 0xf8,"meta%d",(ulong)(uint)n);
    sprintf((char *)&fconfig.num_blocks_readahead,"body%d",(ulong)(uint)n);
    strlen(metabuf + 0xf8);
    strlen(bodybuf + 0xf8);
    pvVar3 = (void *)0x10cd09;
    sVar2 = strlen((char *)&fconfig.num_blocks_readahead);
    fdb_doc_create(in_stack_fffffffffffffae8,in_stack_fffffffffffffae0,
                   (size_t)in_stack_fffffffffffffad8,pvVar3,sVar2,(void *)0x10cd40,
                   in_stack_fffffffffffffb00);
    fdb_set((fdb_kvs_handle *)doc,*(fdb_doc **)(&stack0xfffffffffffffad8 + (long)n * 8));
  }
  fdb_commit((fdb_file_handle *)in_stack_fffffffffffffad8,'\0');
  fdb_kvs_close(in_stack_fffffffffffffad8);
  fdb_close((fdb_file_handle *)in_stack_fffffffffffffad8);
  system("rm -rf  dummy1 > errorlog.txt");
  fdb_open((fdb_file_handle **)bodybuf._152_8_,(char *)bodybuf._144_8_,(fdb_config *)bodybuf._136_8_
          );
  fdb_kvs_open_default
            (in_stack_fffffffffffffae0,(fdb_kvs_handle **)in_stack_fffffffffffffad8,
             (fdb_kvs_config *)0x10cdbe);
  fVar1 = fdb_set_log_callback((fdb_kvs_handle *)doc,logCallbackFunc,"db_drop_test");
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x541);
    db_drop_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x541,"void db_drop_test()");
    }
  }
  sprintf(metabuf + 0xf8,"key%d",0);
  sprintf(bodybuf + 0xf8,"meta%d",0);
  sprintf((char *)&fconfig.num_blocks_readahead,"body%d",0);
  fdb_doc_free((fdb_doc *)0x10ce8f);
  bodylen = metabuf + 0xf8;
  strlen(metabuf + 0xf8);
  strlen(bodybuf + 0xf8);
  pvVar3 = (void *)0x10cef6;
  sVar2 = strlen((char *)&fconfig.num_blocks_readahead);
  fdb_doc_create(in_stack_fffffffffffffae8,in_stack_fffffffffffffae0,
                 (size_t)in_stack_fffffffffffffad8,pvVar3,sVar2,(void *)0x10cf2d,(size_t)bodylen);
  fdb_set((fdb_kvs_handle *)doc,(fdb_doc *)in_stack_fffffffffffffad8);
  pvVar3 = (void *)0x10cf4c;
  fdb_commit((fdb_file_handle *)in_stack_fffffffffffffad8,'\0');
  fdb_doc_create(in_stack_fffffffffffffae8,in_stack_fffffffffffffae0,
                 (size_t)in_stack_fffffffffffffad8,pvVar3,0,(void *)0x10cf81,(size_t)bodylen);
  fVar1 = fdb_get((fdb_kvs_handle *)doc,(fdb_doc *)0x0);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x552);
    db_drop_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x552,"void db_drop_test()");
    }
  }
  if (lRam0000000000000028 != 1) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x554);
    db_drop_test::__test_pass = 0;
    if (lRam0000000000000028 != 1) {
      __assert_fail("rdoc->seqnum == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x554,"void db_drop_test()");
    }
  }
  fdb_kvs_close(in_stack_fffffffffffffad8);
  fdb_close((fdb_file_handle *)in_stack_fffffffffffffad8);
  fdb_doc_free((fdb_doc *)0x10d07d);
  for (n = 0; n < 2; n = n + 1) {
    fdb_doc_free((fdb_doc *)0x10d0a3);
  }
  fdb_shutdown();
  memleak_end();
  if (db_drop_test::__test_pass == 0) {
    fprintf(_stderr,"%s FAILED\n","Database drop test");
  }
  else {
    fprintf(_stderr,"%s PASSED\n","Database drop test");
  }
  return;
}

Assistant:

void db_drop_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 3;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc **doc = alca(fdb_doc *, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous dummy files
    r = system(SHELL_DEL " dummy* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 16777216;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;

    // open db
    fdb_open(&dbfile, "./dummy1", &fconfig);
    fdb_kvs_open(dbfile, &db, NULL, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "db_drop_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert first two documents
    for (i=0;i<2;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // commit
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // Remove the database file manually.
    r = system(SHELL_DEL " dummy1 > errorlog.txt");
    (void)r;

    // Open the empty db with the same name.
    fdb_open(&dbfile, "./dummy1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "db_drop_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // now insert a new doc.
    sprintf(keybuf, "key%d", 0);
    sprintf(metabuf, "meta%d", 0);
    sprintf(bodybuf, "body%d", 0);
    fdb_doc_free(doc[0]);
    fdb_doc_create(&doc[0], (void*)keybuf, strlen(keybuf),
        (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
    fdb_set(db, doc[0]);

    // commit
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // search by key
    fdb_doc_create(&rdoc, doc[0]->key, doc[0]->keylen, NULL, 0, NULL, 0);
    status = fdb_get(db, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // Make sure that a doc seqnum starts with one.
    TEST_CHK(rdoc->seqnum == 1);

    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all documents
    fdb_doc_free(rdoc);
    rdoc = NULL;
    for (i=0;i<2;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("Database drop test");
}